

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

uint FSE_optimalTableLog_internal(uint maxTableLog,size_t srcSize,uint maxSymbolValue,uint minus)

{
  uint uVar1;
  uint uVar2;
  int in_ECX;
  uint in_EDX;
  size_t in_RSI;
  uint in_EDI;
  U32 minBits;
  U32 tableLog;
  U32 maxBitsSrc;
  undefined4 local_20;
  
  uVar1 = BIT_highbit32((int)in_RSI - 1);
  uVar2 = FSE_minTableLog(in_RSI,in_EDX);
  local_20 = in_EDI;
  if (in_EDI == 0) {
    local_20 = 0xb;
  }
  if (uVar1 - in_ECX < local_20) {
    local_20 = uVar1 - in_ECX;
  }
  if (local_20 < uVar2) {
    local_20 = uVar2;
  }
  if (local_20 < 5) {
    local_20 = 5;
  }
  if (0xc < local_20) {
    local_20 = 0xc;
  }
  return local_20;
}

Assistant:

unsigned FSE_optimalTableLog_internal(unsigned maxTableLog, size_t srcSize, unsigned maxSymbolValue, unsigned minus)
{
    U32 maxBitsSrc = BIT_highbit32((U32)(srcSize - 1)) - minus;
    U32 tableLog = maxTableLog;
    U32 minBits = FSE_minTableLog(srcSize, maxSymbolValue);
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (maxBitsSrc < tableLog) tableLog = maxBitsSrc;   /* Accuracy can be reduced */
    if (minBits > tableLog) tableLog = minBits;   /* Need a minimum to safely represent all symbol values */
    if (tableLog < FSE_MIN_TABLELOG) tableLog = FSE_MIN_TABLELOG;
    if (tableLog > FSE_MAX_TABLELOG) tableLog = FSE_MAX_TABLELOG;
    return tableLog;
}